

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentDiscreteObservations::JointToIndividualObservationIndices
          (MADPComponentDiscreteObservations *this,Index joI)

{
  long lVar1;
  iterator iVar2;
  EOverflow *this_00;
  _Base_ptr p_Var3;
  Index joI_local;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  joI_local = joI;
  if (this[10] != (MADPComponentDiscreteObservations)0x0) {
    if (this[9] == (MADPComponentDiscreteObservations)0x1) {
      lVar1 = MADPComponentDiscreteObservations::GetJointObservationDiscrete((uint)this);
      p_Var3 = (_Base_ptr)(lVar1 + 0x18);
    }
    else {
      iVar2 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              ::find(*(_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                       **)(this + 0x38),&joI_local);
      if (iVar2._M_node ==
          (_Base_ptr)
          (*(_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
             **)(this + 0x38) + 8)) {
        p_Var3 = (_Base_ptr)operator_new(0x18);
        p_Var3->_M_left = (_Base_ptr)0x0;
        *(undefined8 *)p_Var3 = 0;
        p_Var3->_M_parent = (_Base_ptr)0x0;
        IndexTools::JointToIndividualIndices((uint)&local_30,(vector *)(ulong)joI_local);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var3,&local_30);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
        local_30._M_impl.super__Vector_impl_data._M_start._0_4_ = joI_local;
        local_30._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
        ::
        _M_emplace_unique<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                  (*(_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                     **)(this + 0x38),
                   (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> *
                   )&local_30);
      }
      else {
        iVar2 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                ::find(*(_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                         **)(this + 0x38),&joI_local);
        p_Var3 = iVar2._M_node[1]._M_parent;
      }
    }
    return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var3;
  }
  this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow
            (this_00,
             "MADPComponentDiscreteObservations::JointToIndividualObservationIndices() joint indices are not available, overflow detected"
            );
  __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
}

Assistant:

const std::vector<Index>& 
            JointToIndividualObservationIndices(Index joI) const
        {
            if(!_m_jointIndicesValid)
            {
                throw(EOverflow("MADPComponentDiscreteObservations::JointToIndividualObservationIndices() joint indices are not available, overflow detected"));
            }
            if(_m_cachedAllJointObservations)
                return GetJointObservationDiscrete(joI)->
                    GetIndividualObservationDiscretesIndices();
            else if(_m_jointObservationIndices->find(joI)!=
                    _m_jointObservationIndices->end())
                return(*_m_jointObservationIndices->find(joI)->second);
            else // create new 
            {
                std::vector<Index> *indices=new std::vector<Index>();
                *indices=IndexTools::JointToIndividualIndices(joI,
                                                              GetNrObservations());
                _m_jointObservationIndices->insert(make_pair(joI,indices));
                return(*indices); // deleted in dtor
            }
        }